

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sesschan.c
# Opt level: O0

void sesschan_free(Channel *chan)

{
  int local_1c;
  int i;
  sesschan *sess;
  Channel *chan_local;
  
  delete_callbacks_for_context(&chan[-0x5e].initial_fixed_window_size);
  conf_free((Conf *)chan[-0x5c].vt);
  if (*(long *)&chan[-5].initial_fixed_window_size != 0) {
    backend_free(*(Backend **)&chan[-5].initial_fixed_window_size);
  }
  bufchain_clear((bufchain *)(chan + -4));
  if (*(long *)&chan[-2].initial_fixed_window_size != 0) {
    sftpsrv_free(*(SftpServer **)&chan[-2].initial_fixed_window_size);
  }
  for (local_1c = 0; local_1c < (int)chan[-7].initial_fixed_window_size; local_1c = local_1c + 1) {
    sk_close((Socket *)(&chan[-6].vt)[local_1c]);
  }
  if (chan[-5].vt != (ChannelVtable *)0x0) {
    agentfwd_free((agentfwd *)chan[-5].vt);
  }
  safefree(&chan[-0x5e].initial_fixed_window_size);
  return;
}

Assistant:

static void sesschan_free(Channel *chan)
{
    sesschan *sess = container_of(chan, sesschan, chan);
    int i;

    delete_callbacks_for_context(sess);
    conf_free(sess->conf);
    if (sess->backend)
        backend_free(sess->backend);
    bufchain_clear(&sess->subsys_input);
    if (sess->sftpsrv)
        sftpsrv_free(sess->sftpsrv);
    for (i = 0; i < sess->n_x11_sockets; i++)
        sk_close(sess->x11_sockets[i]);
    if (sess->agent)
        agentfwd_free(sess->agent);

    sfree(sess);
}